

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O1

void kv_ins_var_nentry_test(void)

{
  uint64_t uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ushort *puVar6;
  bnode *pbVar7;
  btree_kv_ops *pbVar8;
  long lVar9;
  ulong __n;
  char *__ptr;
  char cVar10;
  undefined1 *puVar11;
  char *pcVar12;
  long lStack_188;
  long lStack_180;
  timeval tStack_178;
  btree bStack_168;
  btree_kv_ops *pbStack_130;
  long lStack_128;
  char *pcStack_120;
  undefined2 **ppuStack_118;
  char *pcStack_110;
  undefined2 *puStack_108;
  timeval tStack_100;
  bnode *pbStack_f0;
  uint64_t uStack_e8;
  code *pcStack_e0;
  btree_kv_ops local_d8;
  undefined8 uStack_60;
  undefined1 local_58 [8];
  timeval __test_begin;
  undefined1 local_40 [15];
  char local_31 [8];
  uint8_t v;
  undefined7 uVar13;
  
  puVar11 = local_58;
  lVar9 = 0;
  uStack_60 = 0x10390b;
  gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
  uStack_60 = 0x103910;
  memleak_start();
  do {
    pcVar12 = *(char **)((long)&DAT_00109d60 + lVar9);
    uStack_60 = 0x103923;
    sVar5 = strlen(pcVar12);
    uVar3 = (int)sVar5 + 1;
    __n = (ulong)(uVar3 & 0xffff);
    uStack_60 = 0x103932;
    puVar6 = (ushort *)malloc(__n + 2);
    uVar2 = (ushort)uVar3;
    *puVar6 = uVar2 << 8 | uVar2 >> 8;
    uStack_60 = 0x10394f;
    memcpy(puVar6 + 1,pcVar12,__n);
    *(ushort **)(local_40 + lVar9 + -8) = puVar6;
    lVar9 = lVar9 + 8;
  } while (lVar9 == 8);
  uStack_60 = 0x103968;
  pbVar7 = (bnode *)malloc(0x1010);
  pbVar7->kvsize = 0;
  pbVar7->flag = 0;
  pbVar7->level = 0;
  pbVar7->nentry = 0;
  (pbVar7->field_4).data = (void *)0x0;
  pbVar7->kvsize = 0x901;
  pbVar7->level = 1;
  pbVar7->nentry = 2;
  (pbVar7->field_4).data = pbVar7 + 1;
  local_31[0] = 'd';
  pcStack_e0 = (code *)0x10399c;
  btree_str_kv_get_kb64_vb64(&local_d8);
  pcStack_e0 = (code *)0x1039ac;
  (*local_d8.ins_kv)(pbVar7,0,&__test_begin.tv_usec,local_31);
  local_31[0] = local_31[0] + '\x01';
  pcStack_e0 = (code *)0x1039bf;
  (*local_d8.ins_kv)(pbVar7,0,local_40,local_31);
  uVar1 = (pbVar7->field_4).dummy;
  pcStack_e0 = (code *)0x1039d3;
  iVar4 = strcmp((char *)(uVar1 + 2),"longstring");
  if (iVar4 == 0) {
    uVar13 = (undefined7)((ulong)local_58 >> 8);
    puVar11 = (undefined1 *)CONCAT71(uVar13,local_31[0]);
    if (*(char *)(uVar1 + 0xd) != local_31[0]) goto LAB_00103a2a;
    cVar10 = local_31[0] + -1;
    puVar11 = (undefined1 *)CONCAT71(uVar13,cVar10);
    pcStack_e0 = (code *)0x1039f8;
    local_31[0] = cVar10;
    iVar4 = strcmp((char *)(uVar1 + 0x10),"string");
    if (iVar4 == 0) {
      if (*(char *)(uVar1 + 0x17) == cVar10) {
        pcStack_e0 = (code *)0x103a16;
        kv_ins_var_nentry_test();
        return;
      }
      goto LAB_00103a34;
    }
  }
  else {
    pcStack_e0 = (code *)0x103a2a;
    kv_ins_var_nentry_test();
LAB_00103a2a:
    pcStack_e0 = (code *)0x103a2f;
    kv_ins_var_nentry_test();
  }
  pcStack_e0 = (code *)0x103a34;
  kv_ins_var_nentry_test();
LAB_00103a34:
  pcStack_e0 = kv_set_str_key_test;
  kv_ins_var_nentry_test();
  ppuStack_118 = (undefined2 **)0x103a4e;
  pbStack_f0 = pbVar7;
  uStack_e8 = uVar1;
  pcStack_e0 = (code *)puVar11;
  gettimeofday(&tStack_100,(__timezone_ptr_t)0x0);
  ppuStack_118 = (undefined2 **)0x103a53;
  memleak_start();
  pcStack_110 = (char *)0x0;
  ppuStack_118 = (undefined2 **)0x103a64;
  pbVar8 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  ppuStack_118 = (undefined2 **)0x103a71;
  puStack_108 = (undefined2 *)malloc(0xd);
  *puStack_108 = 0xb00;
  *(undefined8 *)(puStack_108 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puStack_108 + 9) = 0x676e69;
  pcVar12 = "teststring";
  ppuStack_118 = (undefined2 **)0x103aa2;
  (*pbVar8->set_key)((btree *)0x0,&pcStack_110,&puStack_108);
  __ptr = pcStack_110;
  ppuStack_118 = (undefined2 **)0x103ab1;
  iVar4 = strcmp(pcStack_110 + 2,"teststring");
  if (iVar4 == 0) {
    ppuStack_118 = (undefined2 **)0x103abd;
    free(__ptr);
    ppuStack_118 = (undefined2 **)0x103ac7;
    pcStack_110 = (char *)malloc(0x15);
    pcStack_110[0] = '\0';
    pcStack_110[1] = '\x13';
    pcStack_110[2] = 'u';
    pcStack_110[3] = 'p';
    pcStack_110[4] = 'd';
    pcStack_110[5] = 'a';
    pcStack_110[6] = 't';
    pcStack_110[7] = 'e';
    pcStack_110[8] = 'd';
    pcStack_110[9] = ' ';
    pcStack_110[10] = 't';
    pcStack_110[0xb] = 'e';
    pcStack_110[0xc] = 's';
    pcStack_110[0xd] = 't';
    pcStack_110[0xe] = 's';
    pcStack_110[0xf] = 't';
    pcStack_110[0x10] = 'r';
    pcStack_110[0x11] = 'i';
    pcStack_110[0x11] = 'i';
    pcStack_110[0x12] = 'n';
    pcStack_110[0x13] = 'g';
    pcStack_110[0x14] = '\0';
    __ptr = "updated teststring";
    pcVar12 = (char *)&puStack_108;
    ppuStack_118 = (undefined2 **)0x103af8;
    (*pbVar8->set_key)((btree *)0x0,pcVar12,&pcStack_110);
    ppuStack_118 = (undefined2 **)0x103b07;
    iVar4 = strcmp((char *)(puStack_108 + 1),"updated teststring");
    if (iVar4 == 0) {
      ppuStack_118 = (undefined2 **)0x103b20;
      kv_set_str_key_test();
      return;
    }
  }
  else {
    ppuStack_118 = (undefined2 **)0x103b2f;
    kv_set_str_key_test();
  }
  ppuStack_118 = (undefined2 **)kv_set_str_value_test;
  kv_set_str_key_test();
  pbStack_130 = pbVar8;
  lStack_128 = lVar9;
  pcStack_120 = __ptr;
  ppuStack_118 = (undefined2 **)pcVar12;
  gettimeofday(&tStack_178,(__timezone_ptr_t)0x0);
  memleak_start();
  lStack_188 = 100;
  bStack_168.vsize = '\b';
  pbVar8 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  (*pbVar8->set_value)(&bStack_168,&lStack_188,&lStack_180);
  if (lStack_188 != lStack_180) {
    kv_set_str_value_test();
  }
  lStack_180 = 200;
  (*pbVar8->set_value)(&bStack_168,&lStack_180,&lStack_188);
  if (lStack_188 != lStack_180) {
    kv_set_str_value_test();
  }
  free(pbVar8);
  memleak_end();
  pcVar12 = "%s PASSED\n";
  if (kv_set_str_value_test()::__test_pass != '\0') {
    pcVar12 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar12,"kv_set_str_value_test");
  return;
}

Assistant:

void kv_ins_var_nentry_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v;
    idx_t idx;
    int cmp, i, offset;
    char *node_str;

    const char *keys[] = {"string",
                          "longstring"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
    }

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    idx = 0;
    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // insert twice at beginning of node
    kv_ops->ins_kv(node, 0, &key_ptrs[idx], (void *)&v);
    idx++;
    v++;
    kv_ops->ins_kv(node, 0, &key_ptrs[idx], (void *)&(v));

    // verify k1 is at entry 0
    offset = sizeof(key_len_t);
    node_str = (char *)((uint8_t *)node->data + offset);
    cmp = strcmp(node_str, keys[1]);
    TEST_CHK(cmp == 0);
    offset += strlen(keys[1]) + 1;
    cmp = memcmp((uint8_t *)node->data + offset, &v, vsize);
    TEST_CHK(cmp == 0);

    v--;
    // verify k0 is at entry 1
    offset += vsize + sizeof(key_len_t);
    node_str = (char *)((uint8_t *)node->data + offset);
    cmp = strcmp(node_str, keys[0]);
    TEST_CHK(cmp == 0);
    offset += strlen(keys[0]) + 1;
    cmp = memcmp((uint8_t *)node->data + offset, &v, vsize);
    TEST_CHK(cmp == 0);

    free(node);
    freevars(key_ptrs, n);
    memleak_end();

    TEST_RESULT("kv_ins_var_nentry_test");
}